

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  char cVar1;
  Bool BVar2;
  char *property;
  bool bVar3;
  bool bVar4;
  uint local_54;
  uint ix;
  uint ch;
  Bool foundLI;
  Bool nodeisOL;
  Bool wasblock;
  Node *lastli;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_18;
  GetTokenMode mode_local;
  Node *list_local;
  TidyDocImpl *doc_local;
  
  node = (Node *)doc->lexer;
  bVar3 = false;
  if ((list != (Node *)0x0) && (bVar3 = false, list->tag != (Dict *)0x0)) {
    bVar3 = list->tag->id == TidyTag_OL;
  }
  if ((list->tag->model & 1) != 0) {
    return;
  }
  ((Lexer *)node)->insert = (IStack *)0x0;
  lexer._4_4_ = mode;
  pNStack_18 = list;
  list_local = &doc->root;
  do {
    while( true ) {
      while( true ) {
        do {
          parent = prvTidyGetToken((TidyDocImpl *)list_local,IgnoreWhitespace);
          if (parent == (Node *)0x0) {
            prvTidyReport((TidyDocImpl *)list_local,pNStack_18,(Node *)0x0,0x25a);
            return;
          }
          ix = 0;
          if ((parent->tag == pNStack_18->tag) && (parent->type == EndTag)) {
            prvTidyFreeNode((TidyDocImpl *)list_local,parent);
            pNStack_18->closed = yes;
            return;
          }
          BVar2 = InsertMisc(pNStack_18,parent);
        } while (BVar2 != no);
        if ((parent->type == TextNode) || (parent->tag != (Dict *)0x0)) break;
        prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x235);
        prvTidyFreeNode((TidyDocImpl *)list_local,parent);
      }
      if ((node != (Node *)0x0) && (parent->type == TextNode)) break;
LAB_0014ab05:
      if (parent->type == EndTag) {
        if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
           (parent->tag->id != TidyTag_FORM)) {
          BVar2 = prvTidynodeHasCM(parent,0x10);
          if (BVar2 == no) {
            lastli = pNStack_18->parent;
            while ((lastli != (Node *)0x0 &&
                   (((lastli == (Node *)0x0 || (lastli->tag == (Dict *)0x0)) ||
                    (lastli->tag->id != TidyTag_BODY))))) {
              if (parent->tag == lastli->tag) {
                prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x259);
                prvTidyUngetToken((TidyDocImpl *)list_local);
                return;
              }
              lastli = lastli->parent;
            }
            prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x235);
            prvTidyFreeNode((TidyDocImpl *)list_local,parent);
          }
          else {
            prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x235);
            prvTidyPopInline((TidyDocImpl *)list_local,parent);
            prvTidyFreeNode((TidyDocImpl *)list_local,parent);
          }
        }
        else {
          BadForm((TidyDocImpl *)list_local);
          prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x235);
          prvTidyFreeNode((TidyDocImpl *)list_local,parent);
        }
      }
      else {
        if ((((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
            (parent->tag->id != TidyTag_LI)) && (bVar3)) {
          ix = FindLastLI(pNStack_18,(Node **)&nodeisOL);
        }
        if ((((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
            (parent->tag->id != TidyTag_LI)) &&
           ((BVar2 = prvTidyIsHTML5Mode((TidyDocImpl *)list_local), BVar2 == no || (ix != 0)))) {
          prvTidyUngetToken((TidyDocImpl *)list_local);
          BVar2 = prvTidynodeHasCM(parent,8);
          if ((BVar2 != no) && (*(int *)((long)&node->next + 4) != 0)) {
            prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x259);
            return;
          }
          if (*(int *)&node->content != 0) {
            BVar2 = prvTidynodeHasCM(parent,0x380);
            if (BVar2 != no) {
              return;
            }
            if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
               (parent->tag->id == TidyTag_TABLE)) {
              return;
            }
          }
          if (((pNStack_18 == (Node *)0x0) || (pNStack_18->tag == (Dict *)0x0)) ||
             ((pNStack_18->tag->id != TidyTag_OL ||
              (BVar2 = FindLastLI(pNStack_18,(Node **)&nodeisOL), BVar2 == no)))) {
            BVar2 = prvTidynodeHasCM(parent,8);
            parent = prvTidyInferredTag((TidyDocImpl *)list_local,TidyTag_LI);
            property = "list-style: none";
            if (BVar2 != no) {
              property = "list-style: none; display: inline";
            }
            prvTidyAddStyleProperty((TidyDocImpl *)list_local,parent,property);
            prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x261);
            prvTidyInsertNodeAtEnd(pNStack_18,parent);
          }
          else {
            parent = prvTidyInferredTag((TidyDocImpl *)list_local,TidyTag_LI);
            prvTidyReport((TidyDocImpl *)list_local,pNStack_18,parent,0x261);
            prvTidyFreeNode((TidyDocImpl *)list_local,parent);
            parent = _nodeisOL;
          }
        }
        else {
          prvTidyInsertNodeAtEnd(pNStack_18,parent);
        }
        ParseTag((TidyDocImpl *)list_local,parent,IgnoreWhitespace);
      }
    }
    local_54 = parent->start;
    while( true ) {
      bVar4 = false;
      if (local_54 < parent->end) {
        cVar1 = *(char *)((long)&(node[1].parent)->parent + (ulong)local_54);
        bVar4 = false;
        if ((((cVar1 != '\0') && (bVar4 = true, cVar1 != ' ')) && (bVar4 = true, cVar1 != '\t')) &&
           (bVar4 = true, cVar1 != '\r')) {
          bVar4 = cVar1 == '\n';
        }
      }
      if (!bVar4) break;
      local_54 = local_54 + 1;
    }
    if (local_54 < parent->end) goto LAB_0014ab05;
    prvTidyFreeNode((TidyDocImpl *)list_local,parent);
  } while( true );
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_list = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;
    Bool nodeisOL = nodeIsOL(list);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_list++;
    SPRTF("Entering ParseList %d...\n",in_parse_list);
#endif
    if (list->tag->model & CM_EMPTY)
    {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_list--;
        SPRTF("Exit ParseList 1 %d... CM_EMPTY\n",in_parse_list);
#endif
        return;
    }
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_list--;
            SPRTF("Exit ParseList 2 %d... Endtag\n",in_parse_list);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_list--;
                    SPRTF("Exit ParseList 3 %d... No End Tag\n",in_parse_list);
#endif
                    return;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 4 %d... No End Tag\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 5 %d... exiled\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
#if defined(ENABLE_DEBUG_LOG)
    in_parse_list--;
    SPRTF("Exit ParseList 6 %d... missing end tag\n",in_parse_list);
#endif
}